

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall tchecker::clockbounds::df_solver_t::df_solver_t(df_solver_t *this,system_t *system)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  db_t *pdVar4;
  invalid_argument *this_00;
  uint uVar5;
  loc_id_t id;
  ulong uVar6;
  allocator_type local_49;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  value_type_conflict3 local_40;
  undefined4 uStack_3c;
  
  this->_loc_number =
       (loc_id_t)
       ((ulong)((long)*(pointer *)
                       ((long)&(system->super_system_t).super_system_t.super_locs_t._locs.
                               super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                               ._M_impl.super__Vector_impl_data + 8) -
               (long)(system->super_system_t).super_system_t.super_locs_t._locs.
                     super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
  sVar3 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&(system->super_system_t).super_system_t.super_clocks_t._clock_variables.
                     super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._flattened_variables);
  this->_clock_number = (clock_id_t)sVar3;
  local_48 = &this->_loc_pid;
  local_40 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (local_48,(ulong)this->_loc_number,&stack0xffffffffffffffc0,&local_49);
  uVar2 = this->_loc_number;
  uVar1 = this->_clock_number;
  uVar5 = uVar1 * uVar2 + 1;
  this->_dim = (ulong)uVar5;
  this->_L = (db_t *)0x0;
  this->_U = (db_t *)0x0;
  this->_updated_L = false;
  this->_updated_U = false;
  if ((uVar1 != 0 && uVar2 != 0) && ((uVar5 < uVar2 || (uVar5 < uVar1)))) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"invalid number of clocks or locations (overflow)");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  for (uVar6 = 0; uVar6 < uVar2; uVar6 = uVar6 + 1) {
    tchecker::system::locs_t::location((locs_t *)&stack0xffffffffffffffc0,(int)system + 0x230);
    (this->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = *(uint *)CONCAT44(uStack_3c,local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    uVar2 = this->_loc_number;
  }
  uVar6 = this->_dim * this->_dim;
  uVar6 = -(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4;
  pdVar4 = (db_t *)operator_new__(uVar6);
  this->_L = pdVar4;
  pdVar4 = (db_t *)operator_new__(uVar6);
  this->_U = pdVar4;
  clear(this);
  return;
}

Assistant:

df_solver_t::df_solver_t(tchecker::ta::system_t const & system)
    : _loc_number(system.locations_count()), _clock_number(system.clock_variables().size(tchecker::VK_FLATTENED)),
      _loc_pid(_loc_number, 0),
      _dim(1 + _loc_number * _clock_number), // 1 variable for each clock in each location, plus 1 for dummy clock 0
      _L(nullptr), _U(nullptr), _updated_L(false), _updated_U(false)
{
  if ((_loc_number > 0) && (_clock_number > 0) && ((_dim < _loc_number) || (_dim < _clock_number)))
    throw std::invalid_argument("invalid number of clocks or locations (overflow)");

  for (tchecker::loc_id_t id = 0; id < _loc_number; ++id)
    _loc_pid[id] = system.location(id)->pid();

  _L = new tchecker::dbm::db_t[_dim * _dim];
  _U = new tchecker::dbm::db_t[_dim * _dim];
  clear();
}